

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_currency.cpp
# Opt level: O2

void __thiscall
icu_63::numparse::impl::CombinedCurrencyMatcher::CombinedCurrencyMatcher
          (CombinedCurrencyMatcher *this,CurrencySymbols *currencySymbols,DecimalFormatSymbols *dfs,
          parse_flags_t parseFlags,UErrorCode *status)

{
  long lVar1;
  UnicodeString *pUVar2;
  char16_t *pcVar3;
  int32_t i;
  Locale local_110;
  
  (this->super_NumberParseMatcher)._vptr_NumberParseMatcher =
       (_func_int **)&PTR__CombinedCurrencyMatcher_003d9060;
  icu_63::number::impl::CurrencySymbols::getCurrencySymbol(&this->fCurrency1,currencySymbols,status)
  ;
  icu_63::number::impl::CurrencySymbols::getIntlCurrencySymbol
            (&this->fCurrency2,currencySymbols,status);
  this->fUseFullCurrencyData = ((uint)parseFlags >> 0xd & 1) == 0;
  lVar1 = 0;
  do {
    *(undefined ***)(&this->field_0x98 + lVar1) = &PTR__UnicodeString_003e4bf0;
    *(undefined2 *)(&this->field_0xa0 + lVar1) = 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x180);
  pUVar2 = DecimalFormatSymbols::getPatternForCurrencySpacing(dfs,UNUM_CURRENCY_INSERT,'\0',status);
  UnicodeString::UnicodeString(&this->afterPrefixInsert,pUVar2);
  pUVar2 = DecimalFormatSymbols::getPatternForCurrencySpacing
                     (dfs,UNUM_CURRENCY_INSERT,'\x01',status);
  UnicodeString::UnicodeString(&this->beforeSuffixInsert,pUVar2);
  Locale::Locale(&local_110,&dfs->locale);
  CharString::CharString(&this->fLocaleName,local_110.fullName,-1,status);
  Locale::~Locale(&local_110);
  pcVar3 = icu_63::number::impl::CurrencySymbols::getIsoCode(currencySymbols);
  this->fCurrencyCode[2] = pcVar3[2];
  *(undefined4 *)this->fCurrencyCode = *(undefined4 *)pcVar3;
  this->fCurrencyCode[3] = L'\0';
  if (this->fUseFullCurrencyData == false) {
    pUVar2 = (UnicodeString *)&this->field_0x98;
    for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
      icu_63::number::impl::CurrencySymbols::getPluralName
                ((UnicodeString *)&local_110,currencySymbols,(Form)lVar1,status);
      UnicodeString::moveFrom(pUVar2,(UnicodeString *)&local_110);
      UnicodeString::~UnicodeString((UnicodeString *)&local_110);
      pUVar2 = pUVar2 + 1;
    }
  }
  return;
}

Assistant:

CombinedCurrencyMatcher::CombinedCurrencyMatcher(const CurrencySymbols& currencySymbols, const DecimalFormatSymbols& dfs,
                                                 parse_flags_t parseFlags, UErrorCode& status)
        : fCurrency1(currencySymbols.getCurrencySymbol(status)),
          fCurrency2(currencySymbols.getIntlCurrencySymbol(status)),
          fUseFullCurrencyData(0 == (parseFlags & PARSE_FLAG_NO_FOREIGN_CURRENCY)),
          afterPrefixInsert(dfs.getPatternForCurrencySpacing(UNUM_CURRENCY_INSERT, false, status)),
          beforeSuffixInsert(dfs.getPatternForCurrencySpacing(UNUM_CURRENCY_INSERT, true, status)),
          fLocaleName(dfs.getLocale().getName(), -1, status) {
    utils::copyCurrencyCode(fCurrencyCode, currencySymbols.getIsoCode());

    // Pre-load the long names for the current locale and currency
    // if we are parsing without the full currency data.
    if (!fUseFullCurrencyData) {
        for (int32_t i=0; i<StandardPlural::COUNT; i++) {
            auto plural = static_cast<StandardPlural::Form>(i);
            fLocalLongNames[i] = currencySymbols.getPluralName(plural, status);
        }
    }

    // TODO: Figure out how to make this faster and re-enable.
    // Computing the "lead code points" set for fastpathing is too slow to use in production.
    // See http://bugs.icu-project.org/trac/ticket/13584
//    // Compute the full set of characters that could be the first in a currency to allow for
//    // efficient smoke test.
//    fLeadCodePoints.add(fCurrency1.char32At(0));
//    fLeadCodePoints.add(fCurrency2.char32At(0));
//    fLeadCodePoints.add(beforeSuffixInsert.char32At(0));
//    uprv_currencyLeads(fLocaleName.data(), fLeadCodePoints, status);
//    // Always apply case mapping closure for currencies
//    fLeadCodePoints.closeOver(USET_ADD_CASE_MAPPINGS);
//    fLeadCodePoints.freeze();
}